

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_PegoutTx1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_PegoutTx1_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  char *str_buffer;
  char *in_stack_00000270;
  int64_t in_stack_00000278;
  AssertionResult gtest_ar_15;
  void *in_stack_00000290;
  void *in_stack_00000298;
  AssertionResult gtest_ar_14;
  char *in_stack_000002b8;
  AssertionResult gtest_ar_13;
  int64_t calc_fee;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  uint32_t append_count;
  char *output_tx_hex;
  int64_t tx_fee;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *fund_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffa88;
  AssertionResult *in_stack_fffffffffffffa90;
  int *rhs;
  CfdErrorCode *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  void **in_stack_fffffffffffffaa8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  AssertionResult *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  undefined8 in_stack_fffffffffffffb50;
  undefined1 bool_value;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  char *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  int key;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  void *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  int64_t in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  uint32_t asset_index;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  char *in_stack_fffffffffffffc08;
  AssertHelper local_388;
  Message local_380;
  undefined4 local_374;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined4 local_32c;
  AssertionResult local_328;
  char *local_318;
  AssertHelper local_310;
  Message local_308;
  undefined4 local_2fc;
  AssertionResult local_2f8;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined8 local_2d8;
  AssertionResult local_2d0;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined4 local_2ac;
  AssertionResult local_2a8;
  undefined8 local_298;
  AssertHelper local_290;
  Message local_288;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined8 local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  AssertionResult local_230;
  undefined4 local_21c;
  char *local_218;
  AssertHelper local_208;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint32_t in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe18;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  uint32_t *append_txout_count;
  int64_t *in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  AssertHelper in_stack_ffffffffffffff88;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  bool_value = (undefined1)((ulong)in_stack_fffffffffffffb50 >> 0x38);
  key = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  asset_index = (uint32_t)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffaa8);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3df27a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x86b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3df2dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df332);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,(type *)0x3df366);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(internal *)&local_60,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x86c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff88,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x3df462);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df4dd);
  append_txout_count = (uint32_t *)0x0;
  local_14 = CfdInitializeFundRawTx
                       (in_stack_fffffffffffffe18.ptr_,in_stack_fffffffffffffe14,
                        in_stack_fffffffffffffe10,
                        (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                        (void **)in_stack_fffffffffffffe00.ptr_);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3df5c3);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x871,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3df626);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df67e);
  if (local_14 == 0) {
    rhs = (int *)0x0;
    local_14 = CfdAddUtxoTemplateForFundRawTx
                         (in_stack_00000298,in_stack_00000290,(char *)gtest_ar_15.message_.ptr_,
                          gtest_ar_15._4_4_,in_stack_00000278,in_stack_00000270,
                          (char *)gtest_ar_14.message_.ptr_,in_stack_000002b8);
    local_dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3df780);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x87b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message((Message *)0x3df7e3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df83b);
    in_stack_fffffffffffffa90 = (AssertionResult *)0x0;
    local_14 = CfdAddUtxoTemplateForFundRawTx
                         (in_stack_00000298,in_stack_00000290,(char *)gtest_ar_15.message_.ptr_,
                          gtest_ar_15._4_4_,in_stack_00000278,in_stack_00000270,
                          (char *)gtest_ar_14.message_.ptr_,in_stack_000002b8);
    local_104 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      in_stack_fffffffffffffc08 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3df932);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x884,in_stack_fffffffffffffc08);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x3df995);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3df9ed);
    local_14 = CfdAddTargetAmountForFundRawTx
                         (in_stack_fffffffffffffc08,
                          (void *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                          asset_index,in_stack_fffffffffffffbf0,
                          (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                          in_stack_fffffffffffffbe0);
    local_12c = 0;
    pAVar4 = &local_128;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3dfac8);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x889,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x3dfb2b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dfb83);
    local_14 = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffb78,
                          (void *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),key,
                          (int64_t)in_stack_fffffffffffffb60,
                          (double)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                          (bool)bool_value);
    local_154 = 0;
    pAVar4 = &local_150;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3dfc5c);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x88d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x3dfcbf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dfd17);
    local_14 = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffb78,
                          (void *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),key,
                          (int64_t)in_stack_fffffffffffffb60,
                          (double)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                          (bool)bool_value);
    local_17c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3dfdee);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x890,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      testing::Message::~Message((Message *)0x3dfe51);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3dfea9);
    local_14 = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffb78,
                          (void *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),key,
                          (int64_t)in_stack_fffffffffffffb60,
                          (double)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                          (bool)bool_value);
    local_1a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      in_stack_fffffffffffffba8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3dff82);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x893,in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x3dffe5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e003d);
    local_14 = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffb78,
                          (void *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),key,
                          (int64_t)in_stack_fffffffffffffb60,
                          (double)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                          (bool)bool_value);
    local_1cc = 0;
    pAVar4 = &local_1c8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_1d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0119);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x896,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1e0);
      testing::Message::~Message((Message *)0x3e017c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e01d4);
    local_14 = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffffb78,
                          (void *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),key,
                          (int64_t)in_stack_fffffffffffffb60,
                          (double)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                          (bool)bool_value);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe10);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe00);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e02b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x899,pcVar3);
      testing::internal::AssertHelper::operator=(&local_208,(Message *)&stack0xfffffffffffffe00);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      testing::Message::~Message((Message *)0x3e0313);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e036b);
    local_218 = (char *)0x0;
    local_21c = 0;
    local_14 = CfdFinalizeFundRawTx
                         (in_stack_ffffffffffffff88.data_,(void *)in_stack_ffffffffffffff80,
                          (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,append_txout_count,
                          (char **)in_stack_ffffffffffffff58.ptr_);
    local_234 = 0;
    this_01 = &local_230;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      in_stack_fffffffffffffb60 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3e0472);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8a1,in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x3e04d5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e052d);
    if (local_14 == 0) {
      local_260 = 0xbe;
      this_00 = &local_258;
      testing::internal::EqHelper<false>::Compare<long,long>
                ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                 (long *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      if (!bVar1) {
        testing::Message::Message(&local_268);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e05e9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_270,&local_268);
        testing::internal::AssertHelper::~AssertHelper(&local_270);
        testing::Message::~Message((Message *)0x3e064c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e06a1);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_280,"kExpTxData","output_tx_hex",
                 "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000be000000000000"
                 ,local_218);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
      if (!bVar1) {
        testing::Message::Message(&local_288);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0742);
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,&local_288);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        testing::Message::~Message((Message *)0x3e07a5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e07fd);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffa98);
      local_298 = 0;
      local_14 = CfdGetCalculateFeeFundRawTx
                           (in_stack_fffffffffffffba8,
                            (void *)CONCAT17(uVar2,in_stack_fffffffffffffba0),(int64_t *)pAVar4);
      local_2ac = 0;
      in_stack_fffffffffffffb20 = &local_2a8;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                 in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
      in_stack_fffffffffffffb2f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffb20);
      if (!(bool)in_stack_fffffffffffffb2f) {
        testing::Message::Message(&local_2b8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e08e7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8a9,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        testing::Message::~Message((Message *)0x3e094a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e099f);
      local_2d8 = 0xbc;
      testing::internal::EqHelper<false>::Compare<long,long>
                ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                 (long *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
      if (!bVar1) {
        testing::Message::Message(&local_2e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0a4d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x8aa,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
        testing::internal::AssertHelper::~AssertHelper(&local_2e8);
        testing::Message::~Message((Message *)0x3e0aaa);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e0aff);
    }
    local_14 = CfdFreeFundRawTxHandle(this_01,in_stack_fffffffffffffb60);
    local_2fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0bbe);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8ae,pcVar3);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x3e0c1b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e0c70);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffacf,
                                                  in_stack_fffffffffffffac8));
  if (local_14 != 0) {
    local_318 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                          (char **)in_stack_fffffffffffffb20);
    local_32c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98
               ,(int *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
    if (!bVar1) {
      testing::Message::Message(&local_338);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0d5d);
      testing::internal::AssertHelper::AssertHelper
                (&local_340,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8b5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_340,&local_338);
      testing::internal::AssertHelper::~AssertHelper(&local_340);
      testing::Message::~Message((Message *)0x3e0dba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e0e0f);
    testing::internal::CmpHelperSTREQ((internal *)&local_350,"\"\"","str_buffer","",local_318);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e0ea4);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x8b6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message((Message *)0x3e0f01);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e0f56);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffa98);
    local_318 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffa98);
  local_374 = 0;
  pAVar4 = &local_370;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&pAVar4->success_,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3e1026);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x8bc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message((Message *)0x3e1083);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3e10d8);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_PegoutTx1) {
  // 2 output data
  // fee: 190
  static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  // fee: 188
  //static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40400a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  // fee: 187 Failed to select coin. Not enough utxos
  // static const char* const kTxData = "020000000000020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40500a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a00000000";
  static const char* const kExpTxData = "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000001d40200a06a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f1976a914844d3afb2081df687e6c0a83d2a5e0925c4fa01f88ac2102f6e02ce0c684096337672d7d72bc33c5129f9079c50447452aa7139ef3632f4e4101bf561427da009d383256e347ca4d3ea35908e3543412be2629bc565e7a1fbb349de22d51d66391a8281abcfa0d06c9eae6b6fe7156aba53f0865f4502f0201920125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000000284fe98a24b72e327254ccbb6056de98bd48e43e7a536d213c110b90ca612fde5016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000be000000000000";
  static const char* const kFeeAsset = "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fund_handle = nullptr;
  ret = CfdInitializeFundRawTx(
    handle, kCfdNetworkLiquidv1, 1, kFeeAsset, &fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    ret = CfdAddUtxoTemplateForFundRawTx(
        handle, fund_handle,
        "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 0,
        60000,
        "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
        kFeeAsset,
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddUtxoTemplateForFundRawTx(
        handle, fund_handle,
        "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 1,
        60000,
        "wpkh(03e68167b077f06fdcef2b1c4b914df53fcdc4ea2ed43852cc3c2abf2b7992b729)",
        kFeeAsset,
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0,
        0, kFeeAsset,
        "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxKnapsackMinChange, 0, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxBlindMinimumBits, 36, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxDustFeeRate, 0, 1.0, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle,
        kCfdFundTxLongTermFeeRate, 0, 0.15, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee;
    char* output_tx_hex = nullptr;
    uint32_t append_count = 0;
    ret = CfdFinalizeFundRawTx(
        handle, fund_handle, kTxData, 0.15, &tx_fee, &append_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(static_cast<int64_t>(190), tx_fee);
      EXPECT_STREQ(kExpTxData, output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);

      int64_t calc_fee = 0;
      ret = CfdGetCalculateFeeFundRawTx(handle, fund_handle, &calc_fee);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(static_cast<int64_t>(188), calc_fee);
    }

    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}